

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O0

void __thiscall maxNodeHeap::decreaseKey(maxNodeHeap *this,NodeID node,Gain gain)

{
  int iVar1;
  int pos;
  mapped_type *pmVar2;
  reference pvVar3;
  reference pvVar4;
  int heap_idx;
  int queue_idx;
  Gain gain_local;
  NodeID node_local;
  maxNodeHeap *this_local;
  
  queue_idx = node;
  _gain_local = this;
  pmVar2 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](&this->m_element_index,&queue_idx);
  iVar1 = *pmVar2;
  pvVar3 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
           operator[](&this->m_elements,(long)iVar1);
  pos = QElement<maxNodeHeap::Data>::get_index(pvVar3);
  pvVar3 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
           operator[](&this->m_elements,(long)iVar1);
  QElement<maxNodeHeap::Data>::set_key(pvVar3,gain);
  pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (&this->m_heap,(long)pos);
  pvVar4->first = gain;
  siftDown(this,pos);
  return;
}

Assistant:

inline void maxNodeHeap::decreaseKey(NodeID node, Gain gain) {
        int queue_idx = m_element_index[node];
        int heap_idx  = m_elements[queue_idx].get_index();
        m_elements[queue_idx].set_key(gain);
        m_heap[heap_idx].first = gain;
        siftDown(heap_idx);
}